

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilsTests.cpp
# Opt level: O0

int testSpecDowngradePipeline(void)

{
  int32 iVar1;
  PipelineClassifier *pPVar2;
  Pipeline *pPVar3;
  ModelDescription *pMVar4;
  FeatureDescription *pFVar5;
  FeatureType *pFVar6;
  ImageFeatureType *pIVar7;
  Model *pMVar8;
  ArrayFeatureType *pAVar9;
  VisionFeaturePrint *this;
  VisionFeaturePrint_Scene *this_00;
  GLMClassifier *this_01;
  GLMClassifier_DoubleArray *this_02;
  StringVector *pSVar10;
  ostream *poVar11;
  undefined1 local_c8 [8];
  Model model;
  int i;
  GLMClassifier_DoubleArray *weights;
  GLMClassifier *glm;
  FeatureDescription *classifierOutput;
  FeatureDescription *classifierInput;
  Model *classifierModel;
  FeatureDescription *featureOutput;
  FeatureDescription *featureInput;
  Model *featureModel;
  FeatureDescription *output;
  FeatureDescription *input;
  Pipeline *pipeline;
  undefined1 local_40 [8];
  Model spec;
  int32_t latestVersion;
  
  spec._cached_size_ = 5;
  CoreML::Specification::Model::Model((Model *)local_40);
  CoreML::Specification::Model::set_specificationversion((Model *)local_40,spec._cached_size_);
  pPVar2 = CoreML::Specification::Model::mutable_pipelineclassifier((Model *)local_40);
  pPVar3 = CoreML::Specification::PipelineClassifier::mutable_pipeline(pPVar2);
  pMVar4 = CoreML::Specification::Model::mutable_description((Model *)local_40);
  pFVar5 = CoreML::Specification::ModelDescription::add_input(pMVar4);
  CoreML::Specification::FeatureDescription::set_name(pFVar5,"image");
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  pIVar7 = CoreML::Specification::FeatureType::mutable_imagetype(pFVar6);
  CoreML::Specification::ImageFeatureType::set_width(pIVar7,299);
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  pIVar7 = CoreML::Specification::FeatureType::mutable_imagetype(pFVar6);
  CoreML::Specification::ImageFeatureType::set_height(pIVar7,299);
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  pIVar7 = CoreML::Specification::FeatureType::mutable_imagetype(pFVar6);
  CoreML::Specification::ImageFeatureType::set_colorspace(pIVar7,ImageFeatureType_ColorSpace_BGR);
  pMVar4 = CoreML::Specification::Model::mutable_description((Model *)local_40);
  pFVar5 = CoreML::Specification::ModelDescription::add_output(pMVar4);
  CoreML::Specification::FeatureDescription::set_name(pFVar5,"classLabel");
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar6);
  pMVar4 = CoreML::Specification::Model::mutable_description((Model *)local_40);
  CoreML::Specification::ModelDescription::set_predictedfeaturename(pMVar4,"classLabel");
  pMVar8 = CoreML::Specification::Pipeline::add_models(pPVar3);
  CoreML::Specification::Model::set_specificationversion(pMVar8,spec._cached_size_);
  pMVar4 = CoreML::Specification::Model::mutable_description(pMVar8);
  pFVar5 = CoreML::Specification::ModelDescription::add_input(pMVar4);
  CoreML::Specification::FeatureDescription::set_name(pFVar5,"image");
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  pIVar7 = CoreML::Specification::FeatureType::mutable_imagetype(pFVar6);
  CoreML::Specification::ImageFeatureType::set_width(pIVar7,299);
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  pIVar7 = CoreML::Specification::FeatureType::mutable_imagetype(pFVar6);
  CoreML::Specification::ImageFeatureType::set_height(pIVar7,299);
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  pIVar7 = CoreML::Specification::FeatureType::mutable_imagetype(pFVar6);
  CoreML::Specification::ImageFeatureType::set_colorspace(pIVar7,ImageFeatureType_ColorSpace_BGR);
  pMVar4 = CoreML::Specification::Model::mutable_description(pMVar8);
  pFVar5 = CoreML::Specification::ModelDescription::add_output(pMVar4);
  CoreML::Specification::FeatureDescription::set_name(pFVar5,"features");
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  pAVar9 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar6);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar9,ArrayFeatureType_ArrayDataType_FLOAT32);
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  pAVar9 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar6);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar9,0x800);
  this = CoreML::Specification::Model::mutable_visionfeatureprint(pMVar8);
  this_00 = CoreML::Specification::CoreMLModels::VisionFeaturePrint::mutable_scene(this);
  CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::set_version
            (this_00,VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_1);
  pMVar8 = CoreML::Specification::Pipeline::add_models(pPVar3);
  CoreML::Specification::Model::set_specificationversion(pMVar8,spec._cached_size_);
  pMVar4 = CoreML::Specification::Model::mutable_description(pMVar8);
  pFVar5 = CoreML::Specification::ModelDescription::add_input(pMVar4);
  CoreML::Specification::FeatureDescription::set_name(pFVar5,"features");
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  pAVar9 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar6);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar9,ArrayFeatureType_ArrayDataType_FLOAT32);
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  pAVar9 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar6);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar9,0x800);
  pMVar4 = CoreML::Specification::Model::mutable_description(pMVar8);
  pFVar5 = CoreML::Specification::ModelDescription::add_output(pMVar4);
  CoreML::Specification::FeatureDescription::set_name(pFVar5,"classLabel");
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar6);
  pMVar4 = CoreML::Specification::Model::mutable_description(pMVar8);
  CoreML::Specification::ModelDescription::set_predictedfeaturename(pMVar4,"classLabel");
  this_01 = CoreML::Specification::Model::mutable_glmclassifier(pMVar8);
  CoreML::Specification::GLMClassifier::set_postevaluationtransform
            (this_01,GLMClassifier_PostEvaluationTransform_Logit);
  CoreML::Specification::GLMClassifier::add_offset(this_01,0.0);
  this_02 = CoreML::Specification::GLMClassifier::add_weights(this_01);
  for (model.m_spec.super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._4_4_ = 0;
      model.m_spec.super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ < 0x800;
      model.m_spec.super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ =
           model.m_spec.super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi._4_4_ + 1) {
    CoreML::Specification::GLMClassifier_DoubleArray::add_value(this_02,0.0);
  }
  pSVar10 = CoreML::Specification::GLMClassifier::mutable_stringclasslabels(this_01);
  CoreML::Specification::StringVector::add_vector(pSVar10,"cat");
  pSVar10 = CoreML::Specification::GLMClassifier::mutable_stringclasslabels(this_01);
  CoreML::Specification::StringVector::add_vector(pSVar10,"dog");
  CoreML::Model::Model((Model *)local_c8,(Model *)local_40);
  pMVar8 = CoreML::Model::getProto((Model *)local_c8);
  iVar1 = CoreML::Specification::Model::specificationversion(pMVar8);
  if (iVar1 == 3) {
    pMVar8 = CoreML::Model::getProto((Model *)local_c8);
    pPVar2 = CoreML::Specification::Model::pipelineclassifier(pMVar8);
    pPVar3 = CoreML::Specification::PipelineClassifier::pipeline(pPVar2);
    pMVar8 = CoreML::Specification::Pipeline::models(pPVar3,0);
    iVar1 = CoreML::Specification::Model::specificationversion(pMVar8);
    if (iVar1 == 3) {
      pMVar8 = CoreML::Model::getProto((Model *)local_c8);
      pPVar2 = CoreML::Specification::Model::pipelineclassifier(pMVar8);
      pPVar3 = CoreML::Specification::PipelineClassifier::pipeline(pPVar2);
      pMVar8 = CoreML::Specification::Pipeline::models(pPVar3,1);
      iVar1 = CoreML::Specification::Model::specificationversion(pMVar8);
      if (iVar1 == 1) {
        spec._oneof_case_[0] = 0;
      }
      else {
        poVar11 = std::operator<<((ostream *)&std::cout,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UtilsTests.cpp"
                                 );
        poVar11 = std::operator<<(poVar11,":");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x4f);
        poVar11 = std::operator<<(poVar11,": error: ");
        poVar11 = std::operator<<(poVar11,
                                  "(model.getProto().pipelineclassifier().pipeline().models(1).specificationversion()) == (MLMODEL_SPECIFICATION_VERSION_IOS11)"
                                 );
        poVar11 = std::operator<<(poVar11," was false, expected true.");
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        spec._oneof_case_[0] = 1;
      }
    }
    else {
      poVar11 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UtilsTests.cpp"
                               );
      poVar11 = std::operator<<(poVar11,":");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x4c);
      poVar11 = std::operator<<(poVar11,": error: ");
      poVar11 = std::operator<<(poVar11,
                                "(model.getProto().pipelineclassifier().pipeline().models(0).specificationversion()) == (MLMODEL_SPECIFICATION_VERSION_IOS12)"
                               );
      poVar11 = std::operator<<(poVar11," was false, expected true.");
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      spec._oneof_case_[0] = 1;
    }
  }
  else {
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UtilsTests.cpp"
                             );
    poVar11 = std::operator<<(poVar11,":");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x49);
    poVar11 = std::operator<<(poVar11,": error: ");
    poVar11 = std::operator<<(poVar11,
                              "(model.getProto().specificationversion()) == (MLMODEL_SPECIFICATION_VERSION_IOS12)"
                             );
    poVar11 = std::operator<<(poVar11," was false, expected true.");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    spec._oneof_case_[0] = 1;
  }
  CoreML::Model::~Model((Model *)local_c8);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return spec._oneof_case_[0];
}

Assistant:

int testSpecDowngradePipeline() {

    int32_t latestVersion = MLMODEL_SPECIFICATION_VERSION;

    Specification::Model spec;
    spec.set_specificationversion(latestVersion);
    auto* pipeline = spec.mutable_pipelineclassifier()->mutable_pipeline();

    auto* input = spec.mutable_description()->add_input();
    input->set_name("image");
    input->mutable_type()->mutable_imagetype()->set_width(299);
    input->mutable_type()->mutable_imagetype()->set_height(299);
    input->mutable_type()->mutable_imagetype()->set_colorspace(Specification::ImageFeatureType_ColorSpace_BGR);

    auto* output = spec.mutable_description()->add_output();
    output->set_name("classLabel");
    output->mutable_type()->mutable_stringtype();

    spec.mutable_description()->set_predictedfeaturename("classLabel");

    // VisionFeaturePrint
    auto *featureModel = pipeline->add_models();
    featureModel->set_specificationversion(latestVersion);

    auto* featureInput = featureModel->mutable_description()->add_input();
    featureInput->set_name("image");
    featureInput->mutable_type()->mutable_imagetype()->set_width(299);
    featureInput->mutable_type()->mutable_imagetype()->set_height(299);
    featureInput->mutable_type()->mutable_imagetype()->set_colorspace(Specification::ImageFeatureType_ColorSpace_BGR);

    auto featureOutput = featureModel->mutable_description()->add_output();
    featureOutput->set_name("features");
    featureOutput->mutable_type()->mutable_multiarraytype()->set_datatype(Specification::ArrayFeatureType::FLOAT32);
    featureOutput->mutable_type()->mutable_multiarraytype()->add_shape(2048);


    featureModel->mutable_visionfeatureprint()->mutable_scene()->set_version(Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_1);

    // Logistic regression
    auto *classifierModel = pipeline->add_models();
    classifierModel->set_specificationversion(latestVersion);

    auto classifierInput = classifierModel->mutable_description()->add_input();
    classifierInput->set_name("features");
    classifierInput->mutable_type()->mutable_multiarraytype()->set_datatype(Specification::ArrayFeatureType::FLOAT32);
    classifierInput->mutable_type()->mutable_multiarraytype()->add_shape(2048);

    auto classifierOutput = classifierModel->mutable_description()->add_output();
    classifierOutput->set_name("classLabel");
    classifierOutput->mutable_type()->mutable_stringtype();
    classifierModel->mutable_description()->set_predictedfeaturename("classLabel");

    auto glm = classifierModel->mutable_glmclassifier();
    glm->set_postevaluationtransform(::CoreML::Specification::GLMClassifier_PostEvaluationTransform_Logit);
    glm->add_offset(0.0);
    auto weights = glm->add_weights();
    for (int i=0; i<2048; i++) { weights->add_value(0.0); }
    glm->mutable_stringclasslabels()->add_vector("cat");
    glm->mutable_stringclasslabels()->add_vector("dog");

    // Constructing an CoreML::Model should downgrade spec on load
    Model model(spec);

    // Top level should be IOS 12 because it contains vision feature print
    ML_ASSERT_EQ(model.getProto().specificationversion(), MLMODEL_SPECIFICATION_VERSION_IOS12);

    // First model in pipeline is vision feature print and should have IOS12 spec version
    ML_ASSERT_EQ(model.getProto().pipelineclassifier().pipeline().models(0).specificationversion(), MLMODEL_SPECIFICATION_VERSION_IOS12);

    // Second model is just a GLM which has support in IOS 11
    ML_ASSERT_EQ(model.getProto().pipelineclassifier().pipeline().models(1).specificationversion(), MLMODEL_SPECIFICATION_VERSION_IOS11);

    return 0;
}